

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ifc.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Bitmap::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Bitmap *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  MthdVtxXy *pMVar1;
  MthdBitmapColor1 *pMVar2;
  MthdBitmapColor0 *pMVar3;
  SingleMthdTest *pSVar4;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar5;
  result_type rVar6;
  MthdIfcSize *pMVar7;
  MthdBitmapData *this_01;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_180;
  allocator local_17f;
  allocator local_17e;
  allocator local_17d;
  allocator local_17c;
  allocator local_17b;
  allocator local_17a;
  allocator local_179;
  MthdIfcSize *local_178;
  MthdVtxXy *local_170;
  MthdBitmapColor1 *local_168;
  MthdBitmapColor0 *local_160;
  SingleMthdTest *local_158;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_150;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  SingleMthdTest *local_68;
  MthdBitmapColor0 *local_60;
  MthdBitmapColor1 *local_58;
  MthdVtxXy *local_50;
  MthdIfcSize *local_48;
  MthdIfcSize *local_40;
  MthdBitmapData *local_38;
  
  local_150 = __return_storage_ptr__;
  local_158 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_88,"notify",&local_179);
  pSVar4 = local_158;
  opt = &(this->super_Class).opt;
  MthdNotify::SingleMthdTest
            ((MthdNotify *)local_158,opt,(uint32_t)rVar6,&local_88,-1,(this->super_Class).cls,0x104,
             1,4);
  local_68 = pSVar4;
  local_160 = (MthdBitmapColor0 *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_a8,"color0",&local_17a);
  pMVar3 = local_160;
  MthdBitmapColor0::SingleMthdTest
            (local_160,opt,(uint32_t)rVar6,&local_a8,-1,(this->super_Class).cls,0x308,1,4);
  local_60 = pMVar3;
  local_168 = (MthdBitmapColor1 *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_c8,"color1",&local_17b);
  pMVar2 = local_168;
  MthdBitmapColor1::SingleMthdTest
            (local_168,opt,(uint32_t)rVar6,&local_c8,-1,(this->super_Class).cls,0x30c,1,4);
  local_58 = pMVar2;
  local_170 = (MthdVtxXy *)operator_new(0x25958);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_e8,"xy",&local_17c);
  pMVar1 = local_170;
  MthdVtxXy::MthdVtxXy
            (local_170,opt,(uint32_t)rVar6,&local_e8,-1,(this->super_Class).cls,0x310,1,4,0x21);
  local_50 = pMVar1;
  local_178 = (MthdIfcSize *)operator_new(0x25958);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_108,"size_out",&local_17d);
  pMVar7 = local_178;
  MthdIfcSize::MthdIfcSize
            (local_178,opt,(uint32_t)rVar6,&local_108,-1,(this->super_Class).cls,0x314,0x14);
  local_48 = pMVar7;
  pMVar7 = (MthdIfcSize *)operator_new(0x25958);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_128,"size_in",&local_17e);
  MthdIfcSize::MthdIfcSize
            (pMVar7,opt,(uint32_t)rVar6,&local_128,-1,(this->super_Class).cls,0x318,0x12);
  local_40 = pMVar7;
  this_01 = (MthdBitmapData *)operator_new(0x25958);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_148,"bitmap_data",&local_17f);
  MthdBitmapData::MthdBitmapData
            (this_01,opt,(uint32_t)rVar6,&local_148,-1,(this->super_Class).cls,0x400,0x20,4,true);
  pvVar5 = local_150;
  __l._M_len = 7;
  __l._M_array = &local_68;
  local_38 = this_01;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_150,__l,&local_180);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return pvVar5;
}

Assistant:

std::vector<SingleMthdTest *> Bitmap::mthds() {
	return {
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdBitmapColor0(opt, rnd(), "color0", -1, cls, 0x308),
		new MthdBitmapColor1(opt, rnd(), "color1", -1, cls, 0x30c),
		new MthdVtxXy(opt, rnd(), "xy", -1, cls, 0x310, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdIfcSize(opt, rnd(), "size_out", -1, cls, 0x314, IFC_OUT | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "size_in", -1, cls, 0x318, IFC_IN | IFC_BITMAP),
		new MthdBitmapData(opt, rnd(), "bitmap_data", -1, cls, 0x400, 0x20, 4, true),
	};
}